

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

ConfidentialTransaction * __thiscall
cfd::core::ConfidentialTransaction::operator=
          (ConfidentialTransaction *this,ConfidentialTransaction *transaction)

{
  string local_30;
  
  if (this != transaction) {
    AbstractTransaction::GetHex_abi_cxx11_(&local_30,&transaction->super_AbstractTransaction);
    SetFromHex(this,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return this;
}

Assistant:

ConfidentialTransaction &ConfidentialTransaction::operator=(
    const ConfidentialTransaction &transaction) & {
  if (this != &transaction) {
    SetFromHex(transaction.GetHex());
  }
  return *this;
}